

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalIndexManager.hpp
# Opt level: O0

void __thiscall
OpenMD::IndexListContainer::IndexListContainer(IndexListContainer *this,int minIndex,int maxIndex)

{
  pair<int,_int> this_00;
  undefined4 in_EDX;
  undefined4 *in_RDI;
  int *in_stack_ffffffffffffffb8;
  value_type *__x;
  
  *in_RDI = in_EDX;
  __x = (value_type *)(in_RDI + 2);
  std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::list
            ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x152022);
  this_00 = std::make_pair<int&,int&>(in_stack_ffffffffffffffb8,(int *)0x152031);
  std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
            ((list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00,__x);
  return;
}

Assistant:

IndexListContainer(int minIndex = 0, int maxIndex = MAX_INTEGER) :
        maxIndex_(maxIndex) {
      indexContainer_.push_back(std::make_pair(minIndex, maxIndex));
    }